

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O0

void __thiscall slack::_detail::Session::~Session(Session *this)

{
  Session *this_local;
  
  curl_easy_cleanup(this->curl_);
  curl_global_cleanup();
  std::__cxx11::string::~string((string *)&this->token_);
  std::__cxx11::string::~string((string *)&this->proxy_url_);
  std::__cxx11::string::~string((string *)&this->url_);
  return;
}

Assistant:

~Session() { curl_easy_cleanup(curl_); curl_global_cleanup(); }